

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

void Hop_ObjCleanData_rec(Hop_Obj_t *pObj)

{
  uint uVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x5a,"void Hop_ObjCleanData_rec(Hop_Obj_t *)");
  }
  uVar1 = *(uint *)&pObj->field_0x20 & 7;
  if (uVar1 == 4) {
    Hop_ObjCleanData_rec((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Hop_ObjCleanData_rec((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  }
  else if (uVar1 == 3) {
    __assert_fail("!Hop_ObjIsPo(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopUtil.c"
                  ,0x5b,"void Hop_ObjCleanData_rec(Hop_Obj_t *)");
  }
  (pObj->field_0).pData = (void *)0x0;
  return;
}

Assistant:

void Hop_ObjCleanData_rec( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsPo(pObj) );
    if ( Hop_ObjIsAnd(pObj) )
    {
        Hop_ObjCleanData_rec( Hop_ObjFanin0(pObj) );
        Hop_ObjCleanData_rec( Hop_ObjFanin1(pObj) );
    }
    pObj->pData = NULL;
}